

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestCaseForTestResult
               (ostream *stream,TestResult *result)

{
  TimeInMillis ms;
  TimeInMillis ms_00;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  std::operator<<(stream,"    <testcase");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"testcase",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"name",&local_73);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  OutputXmlAttribute(stream,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"testcase",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"status",&local_73);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"run",&local_71);
  OutputXmlAttribute(stream,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"testcase",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"result",&local_73);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"completed",&local_71);
  OutputXmlAttribute(stream,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"testcase",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"classname",&local_73);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  OutputXmlAttribute(stream,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"testcase",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"time",&local_73);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_70,(internal *)result->elapsed_time_,ms);
  OutputXmlAttribute(stream,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"testcase",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"timestamp",&local_73);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_70,(internal *)result->start_timestamp_,ms_00);
  OutputXmlAttribute(stream,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  OutputXmlTestResult(stream,result);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestCaseForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a minimal test case with a single test.
  *stream << "    <testcase";
  OutputXmlAttribute(stream, "testcase", "name", "");
  OutputXmlAttribute(stream, "testcase", "status", "run");
  OutputXmlAttribute(stream, "testcase", "result", "completed");
  OutputXmlAttribute(stream, "testcase", "classname", "");
  OutputXmlAttribute(stream, "testcase", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testcase", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));

  // Output the actual test result.
  OutputXmlTestResult(stream, result);
}